

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

void __thiscall
Potassco::ProgramOptions::anon_unknown_15::CommandStringParser::CommandStringParser
          (CommandStringParser *this,char *cmd,ParseContext *ctx,uint flags)

{
  _func_int **in_RSI;
  CommandLineParser *in_RDI;
  ParseContext **this_00;
  undefined8 in_stack_ffffffffffffffb0;
  ParseContext *in_stack_ffffffffffffffb8;
  
  CommandLineParser::CommandLineParser
            (in_RDI,in_stack_ffffffffffffffb8,(uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  (in_RDI->super_OptionParser)._vptr_OptionParser = (_func_int **)&PTR__CommandStringParser_0015d838
  ;
  if (in_RSI == (_func_int **)0x0) {
    in_RSI = (_func_int **)0x1454a5;
  }
  in_RDI[1].super_OptionParser._vptr_OptionParser = in_RSI;
  this_00 = &in_RDI[1].super_OptionParser.ctx_;
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::reserve((ulong)this_00);
  return;
}

Assistant:

CommandStringParser(const char* cmd, ParseContext& ctx, unsigned flags)
		: CommandLineParser(ctx, flags)
		, cmd_(cmd ? cmd : "") {
		tok_.reserve(80);
	}